

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]>,_QString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]>,_QString>
                  *this)

{
  QString::~QString((QString *)0x137c70);
  QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]> *)
             0x137c7a);
  return;
}

Assistant:

~QStringBuilder() = default;